

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVRowDown2_C(uint8_t *src_uv,ptrdiff_t src_stride,uint8_t *dst_uv,int dst_width)

{
  int x;
  uint16_t *dst;
  uint16_t *src;
  int dst_width_local;
  uint8_t *dst_uv_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_uv_local;
  
  dst = (uint16_t *)dst_uv;
  src = (uint16_t *)src_uv;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst = src[1];
    dst[1] = src[3];
    src = src + 2;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = src[1];
  }
  return;
}

Assistant:

void ScaleUVRowDown2_C(const uint8_t* src_uv,
                       ptrdiff_t src_stride,
                       uint8_t* dst_uv,
                       int dst_width) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[1];
    dst[1] = src[3];
    src += 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[1];
  }
}